

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_cte_node.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::RecursiveCTENode::Copy(RecursiveCTENode *this)

{
  bool bVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  _Hash_node_base *p_Var3;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var4;
  pointer pRVar5;
  pointer pQVar6;
  pointer pPVar7;
  type other;
  pointer *__ptr;
  QueryNode *in_RSI;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *key;
  _Hash_node_base *this_00;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_48;
  __uniq_ptr_impl<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>_> local_40
  ;
  __uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> local_38;
  
  local_38._M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
  .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
       (tuple<duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)
       (tuple<duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)this;
  make_uniq<duckdb::RecursiveCTENode>();
  pRVar5 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_40);
  ::std::__cxx11::string::_M_assign((string *)&pRVar5->ctename);
  bVar1 = *(bool *)&in_RSI[1].modifiers.
                    super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pRVar5 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_40);
  pRVar5->union_all = bVar1;
  pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *
                      )&in_RSI[1].cte_map);
  (*pQVar6->_vptr_QueryNode[5])(&local_48,pQVar6);
  pRVar5 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_40);
  _Var4._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (QueryNode *)0x0;
  _Var2._M_head_impl =
       (pRVar5->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pRVar5->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var2._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    if (local_48._M_head_impl != (QueryNode *)0x0) {
      (*(local_48._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *
                      )&in_RSI[1].cte_map.map.map.
                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                        .
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  (*pQVar6->_vptr_QueryNode[5])(&local_48,pQVar6);
  pRVar5 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_40);
  _Var4._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (QueryNode *)0x0;
  _Var2._M_head_impl =
       (pRVar5->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pRVar5->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var2._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    if (local_48._M_head_impl != (QueryNode *)0x0) {
      (*(local_48._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  pRVar5 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_40);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pRVar5->aliases,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&in_RSI[1].cte_map.map.map.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  p_Var3 = (_Hash_node_base *)in_RSI[1].cte_map.map.map_idx._M_h._M_element_count;
  for (this_00 = in_RSI[1].cte_map.map.map_idx._M_h._M_before_begin._M_nxt; this_00 != p_Var3;
      this_00 = this_00 + 1) {
    pRVar5 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
             ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                           *)&local_40);
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)this_00);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar7);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pRVar5->key_targets,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_48);
    if (local_48._M_head_impl != (QueryNode *)0x0) {
      (*(local_48._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  other = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
          ::operator*((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                       *)&local_40);
  QueryNode::CopyProperties(in_RSI,&other->super_QueryNode);
  *(tuple<duckdb::RecursiveCTENode_*,_std::default_delete<duckdb::RecursiveCTENode>_> *)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
   super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
       local_40._M_t.
       super__Tuple_impl<0UL,_duckdb::RecursiveCTENode_*,_std::default_delete<duckdb::RecursiveCTENode>_>
       .super__Head_base<0UL,_duckdb::RecursiveCTENode_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (_Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)
         local_38._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<QueryNode> RecursiveCTENode::Copy() const {
	auto result = make_uniq<RecursiveCTENode>();
	result->ctename = ctename;
	result->union_all = union_all;
	result->left = left->Copy();
	result->right = right->Copy();
	result->aliases = aliases;

	for (auto &key : key_targets) {
		result->key_targets.push_back(key->Copy());
	}

	this->CopyProperties(*result);
	return std::move(result);
}